

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O0

error_code __thiscall
asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::cancel
          (basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *this,error_code *ec)

{
  ulong uVar1;
  base_implementation_type *in_RSI;
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
  *in_RDI;
  error_code eVar2;
  error_code *in_stack_ffffffffffffffd0;
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
  *this_00;
  
  this_00 = in_RDI;
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  get_service(in_RDI);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  get_implementation(in_RDI);
  asio::detail::reactive_socket_service_base::cancel
            ((reactive_socket_service_base *)this_00,in_RSI,in_stack_ffffffffffffffd0);
  uVar1._0_4_ = in_RSI->socket_;
  uVar1._4_1_ = in_RSI->state_;
  uVar1._5_3_ = *(undefined3 *)&in_RSI->field_0x5;
  eVar2._0_8_ = uVar1 & 0xffffffff;
  eVar2._M_cat = (error_category *)in_RSI->reactor_data_;
  return eVar2;
}

Assistant:

ASIO_SYNC_OP_VOID cancel(asio::error_code& ec)
  {
    impl_.get_service().cancel(impl_.get_implementation(), ec);
    ASIO_SYNC_OP_VOID_RETURN(ec);
  }